

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

reg_desc_t * find_rd_by_name(MIR_context_t ctx,char *name,MIR_func_t func)

{
  undefined8 *puVar1;
  reg_desc_t obj;
  int iVar2;
  size_t el;
  reg_desc_t *prVar3;
  size_t rdn;
  reg_desc_t rd;
  size_t local_48;
  undefined8 local_40;
  MIR_context_t pMStack_38;
  char *local_30;
  reg_desc_t local_28;
  
  puVar1 = *(undefined8 **)(name + 0x78);
  local_40 = 6;
  pMStack_38 = ctx;
  el = VARR_reg_desc_tlength((VARR_reg_desc_t *)*puVar1);
  obj.name = (char *)pMStack_38;
  obj.type = (undefined4)local_40;
  obj.reg = local_40._4_4_;
  obj.hard_reg_name = local_30;
  VARR_reg_desc_tpush((VARR_reg_desc_t *)*puVar1,obj);
  iVar2 = HTAB_size_t_do((HTAB_size_t *)puVar1[1],el,HTAB_FIND,&local_48);
  if (iVar2 == 0) {
    VARR_reg_desc_tpop(&local_28,(VARR_reg_desc_t *)*puVar1);
    prVar3 = (reg_desc_t *)0x0;
  }
  else {
    VARR_reg_desc_tpop(&local_28,(VARR_reg_desc_t *)*puVar1);
    prVar3 = VARR_reg_desc_taddr((VARR_reg_desc_t *)*puVar1);
    prVar3 = prVar3 + local_48;
  }
  return prVar3;
}

Assistant:

static reg_desc_t *find_rd_by_name (MIR_context_t ctx MIR_UNUSED, const char *name,
                                    MIR_func_t func) {
  func_regs_t func_regs = func->internal;
  size_t rdn, temp_rdn;
  reg_desc_t rd;

  rd.name = (char *) name;
  rd.type = MIR_T_I64;
  rd.reg = 0; /* to eliminate warnings */
  temp_rdn = VARR_LENGTH (reg_desc_t, func_regs->reg_descs);
  VARR_PUSH (reg_desc_t, func_regs->reg_descs, rd);
  if (!HTAB_DO (size_t, func_regs->name2rdn_tab, temp_rdn, HTAB_FIND, rdn)) {
    VARR_POP (reg_desc_t, func_regs->reg_descs);
    return NULL; /* undeclared */
  }
  VARR_POP (reg_desc_t, func_regs->reg_descs);
  return &VARR_ADDR (reg_desc_t, func_regs->reg_descs)[rdn];
}